

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsepos.cpp
# Opt level: O2

int __thiscall
icu_63::ParsePosition::clone
          (ParsePosition *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)UMemory::operator_new((UMemory *)0x10,(size_t)__fn);
  if (puVar1 != (undefined8 *)0x0) {
    *puVar1 = &PTR__ParsePosition_00247b00;
    puVar1[1] = *(undefined8 *)&this->index;
  }
  return (int)puVar1;
}

Assistant:

ParsePosition *
ParsePosition::clone() const {
    return new ParsePosition(*this);
}